

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_deriveBlockSplitsHelper
               (seqStoreSplits *splits,size_t startIdx,size_t endIdx,ZSTD_CCtx *zc,
               seqStore_t *origSeqStore)

{
  uint uVar1;
  ulong endIdx_00;
  size_t code;
  size_t code_00;
  size_t code_01;
  size_t midIdx;
  size_t estimatedSecondHalfSize;
  size_t estimatedFirstHalfSize;
  size_t estimatedOriginalSize;
  seqStore_t secondHalfSeqStore;
  seqStore_t firstHalfSeqStore;
  seqStore_t fullSeqStoreChunk;
  seqStore_t *origSeqStore_local;
  ZSTD_CCtx *zc_local;
  size_t endIdx_local;
  size_t startIdx_local;
  seqStoreSplits *splits_local;
  
  endIdx_00 = startIdx + endIdx >> 1;
  if ((299 < endIdx - startIdx) && (splits->idx < 0xc4)) {
    ZSTD_deriveSeqStoreChunk
              ((seqStore_t *)&firstHalfSeqStore.longLengthType,origSeqStore,startIdx,endIdx);
    ZSTD_deriveSeqStoreChunk
              ((seqStore_t *)&secondHalfSeqStore.longLengthType,origSeqStore,startIdx,endIdx_00);
    ZSTD_deriveSeqStoreChunk((seqStore_t *)&estimatedOriginalSize,origSeqStore,endIdx_00,endIdx);
    code = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                     ((seqStore_t *)&firstHalfSeqStore.longLengthType,zc);
    code_00 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                        ((seqStore_t *)&secondHalfSeqStore.longLengthType,zc);
    code_01 = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                        ((seqStore_t *)&estimatedOriginalSize,zc);
    uVar1 = ERR_isError(code);
    if ((uVar1 == 0) &&
       (((uVar1 = ERR_isError(code_00), uVar1 == 0 && (uVar1 = ERR_isError(code_01), uVar1 == 0)) &&
        (code_00 + code_01 < code)))) {
      ZSTD_deriveBlockSplitsHelper(splits,startIdx,endIdx_00,zc,origSeqStore);
      splits->splitLocations[splits->idx] = (U32)endIdx_00;
      splits->idx = splits->idx + 1;
      ZSTD_deriveBlockSplitsHelper(splits,endIdx_00,endIdx,zc,origSeqStore);
    }
  }
  return;
}

Assistant:

static void ZSTD_deriveBlockSplitsHelper(seqStoreSplits* splits, size_t startIdx, size_t endIdx,
                                         const ZSTD_CCtx* zc, const seqStore_t* origSeqStore) {
    seqStore_t fullSeqStoreChunk;
    seqStore_t firstHalfSeqStore;
    seqStore_t secondHalfSeqStore;
    size_t estimatedOriginalSize;
    size_t estimatedFirstHalfSize;
    size_t estimatedSecondHalfSize;
    size_t midIdx = (startIdx + endIdx)/2;

    if (endIdx - startIdx < MIN_SEQUENCES_BLOCK_SPLITTING || splits->idx >= MAX_NB_SPLITS) {
        return;
    }
    ZSTD_deriveSeqStoreChunk(&fullSeqStoreChunk, origSeqStore, startIdx, endIdx);
    ZSTD_deriveSeqStoreChunk(&firstHalfSeqStore, origSeqStore, startIdx, midIdx);
    ZSTD_deriveSeqStoreChunk(&secondHalfSeqStore, origSeqStore, midIdx, endIdx);
    estimatedOriginalSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&fullSeqStoreChunk, zc);
    estimatedFirstHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&firstHalfSeqStore, zc);
    estimatedSecondHalfSize = ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(&secondHalfSeqStore, zc);
    DEBUGLOG(5, "Estimated original block size: %zu -- First half split: %zu -- Second half split: %zu",
             estimatedOriginalSize, estimatedFirstHalfSize, estimatedSecondHalfSize);
    if (ZSTD_isError(estimatedOriginalSize) || ZSTD_isError(estimatedFirstHalfSize) || ZSTD_isError(estimatedSecondHalfSize)) {
        return;
    }
    if (estimatedFirstHalfSize + estimatedSecondHalfSize < estimatedOriginalSize) {
        ZSTD_deriveBlockSplitsHelper(splits, startIdx, midIdx, zc, origSeqStore);
        splits->splitLocations[splits->idx] = (U32)midIdx;
        splits->idx++;
        ZSTD_deriveBlockSplitsHelper(splits, midIdx, endIdx, zc, origSeqStore);
    }
}